

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncFunction.h
# Opt level: O0

void __thiscall
Js::JavascriptAsyncSpawnStepFunction::JavascriptAsyncSpawnStepFunction
          (JavascriptAsyncSpawnStepFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          JavascriptGenerator *generator,Var argument,Var resolve,Var reject,bool isReject)

{
  bool isReject_local;
  Var resolve_local;
  Var argument_local;
  JavascriptGenerator *generator_local;
  FunctionInfo *functionInfo_local;
  DynamicType *type_local;
  JavascriptAsyncSpawnStepFunction *this_local;
  
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e03790;
  Memory::WriteBarrierPtr<Js::JavascriptGenerator>::WriteBarrierPtr(&this->generator,generator);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->reject,reject);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->resolve,resolve);
  this->isReject = isReject;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->argument,argument);
  return;
}

Assistant:

JavascriptAsyncSpawnStepFunction(
        DynamicType* type,
        FunctionInfo* functionInfo,
        JavascriptGenerator* generator,
        Var argument,
        Var resolve = nullptr,
        Var reject = nullptr,
        bool isReject = false) :
            RuntimeFunction(type, functionInfo),
            generator(generator),
            argument(argument),
            resolve(resolve),
            reject(reject),
            isReject(isReject) {}